

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadzone.cpp
# Opt level: O3

void __thiscall NaDeadZoneFunc::NaDeadZoneFunc(NaDeadZoneFunc *this,char *szOptions,NaVector *vInit)

{
  double dVar1;
  char *szGain;
  char *szRest;
  char *local_28;
  char *local_20;
  
  NaExternFunc::NaExternFunc(&this->super_NaExternFunc);
  *(undefined ***)this = &PTR_PrintLog_00103d30;
  *(undefined4 *)&this->fHalfWidth = 0;
  *(undefined4 *)((long)&this->fHalfWidth + 4) = 0;
  *(undefined4 *)&this->fGain = 0;
  *(undefined4 *)((long)&this->fGain + 4) = 0x3ff00000;
  dVar1 = strtod(szOptions,&local_28);
  if (local_28 != szOptions) {
    this->fHalfWidth = dVar1;
  }
  dVar1 = strtod(local_28,&local_20);
  if (local_28 != local_20) {
    this->fGain = dVar1;
  }
  return;
}

Assistant:

NaDeadZoneFunc::NaDeadZoneFunc (char* szOptions,
				NaVector& vInit)
  : fGain(1.0), fHalfWidth(0.0)
{
  char		*szRest, *szGain, *szHalfWidth = szOptions;
  NaReal	fTest;

  fTest = strtod(szHalfWidth, &szGain);
  if(szHalfWidth != szGain)
    fHalfWidth = fTest;

  fTest = strtod(szGain, &szRest);
  if(szGain != szRest)
    fGain = fTest;
}